

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
          *other)

{
  resizeLike<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>(this,other);
  TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u>>::
  evalToLazy<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>> *)
             other,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  return (Matrix<double,__1,__1,_0,__1,__1> *)this;
}

Assistant:

EIGEN_STRONG_INLINE Derived& operator=(const EigenBase<OtherDerived> &other)
    {
      _resize_to_match(other);
      Base::operator=(other.derived());
      return this->derived();
    }